

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::
statement<char_const(&)[24],char_const(&)[15],char_const*&,char_const(&)[3],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[3],char_const*&,char_const(&)[3]>
          (CompilerGLSL *this,char (*ts) [24],char (*ts_1) [15],char **ts_2,char (*ts_3) [3],
          uint *ts_4,char (*ts_5) [3],uint *ts_6,char (*ts_7) [3],char **ts_8,char (*ts_9) [3])

{
  bool bVar1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  uint local_6c;
  undefined1 local_68 [4];
  uint32_t i;
  char (*local_48) [3];
  uint *ts_local_4;
  char (*ts_local_3) [3];
  char **ts_local_2;
  char (*ts_local_1) [15];
  char (*ts_local) [24];
  CompilerGLSL *this_local;
  
  local_48 = (char (*) [3])ts_4;
  ts_local_4 = (uint *)ts_3;
  ts_local_3 = (char (*) [3])ts_2;
  ts_local_2 = (char **)ts_1;
  ts_local_1 = (char (*) [15])ts;
  ts_local = (char (*) [24])this;
  bVar1 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  if (bVar1) {
    this->statement_count = this->statement_count + 1;
  }
  else if (this->redirect_statement ==
           (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            *)0x0) {
    for (local_6c = 0; local_6c < this->indent; local_6c = local_6c + 1) {
      StringStream<4096UL,_4096UL>::operator<<(&this->buffer,"    ");
    }
    statement_inner<char_const(&)[24],char_const(&)[15],char_const*&,char_const(&)[3],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[3],char_const*&,char_const(&)[3]>
              (this,(char (*) [24])ts_local_1,(char (*) [15])ts_local_2,(char **)ts_local_3,
               (char (*) [3])ts_local_4,(uint *)local_48,ts_5,ts_6,ts_7,ts_8,ts_9);
    StringStream<4096UL,_4096UL>::operator<<(&this->buffer,'\n');
  }
  else {
    this_00 = this->redirect_statement;
    join<char_const(&)[24],char_const(&)[15],char_const*&,char_const(&)[3],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[3],char_const*&,char_const(&)[3]>
              ((string *)local_68,(spirv_cross *)ts_local_1,(char (*) [24])ts_local_2,
               (char (*) [15])ts_local_3,(char **)ts_local_4,local_48,(uint *)ts_5,
               (char (*) [3])ts_6,(uint *)ts_7,(char (*) [3])ts_8,(char **)ts_9,
               (char (*) [3])this_00);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_68);
    ::std::__cxx11::string::~string((string *)local_68);
    this->statement_count = this->statement_count + 1;
  }
  return;
}

Assistant:

inline void statement(Ts &&... ts)
	{
		if (is_forcing_recompilation())
		{
			// Do not bother emitting code while force_recompile is active.
			// We will compile again.
			statement_count++;
			return;
		}

		if (redirect_statement)
		{
			redirect_statement->push_back(join(std::forward<Ts>(ts)...));
			statement_count++;
		}
		else
		{
			for (uint32_t i = 0; i < indent; i++)
				buffer << "    ";
			statement_inner(std::forward<Ts>(ts)...);
			buffer << '\n';
		}
	}